

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O2

string * __thiscall
jsonnet::internal::StaticError::toString_abi_cxx11_
          (string *__return_storage_ptr__,StaticError *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((this->location).begin.line != 0) {
    internal::operator<<(local_190,&this->location);
    std::operator<<(local_190,":");
  }
  poVar1 = std::operator<<(local_190," ");
  std::operator<<(poVar1,(string *)&this->msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        std::stringstream ss;
        if (location.isSet()) {
            ss << location << ":";
        }
        ss << " " << msg;
        return ss.str();
    }